

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalParse
          (GeneratedCodeInfo_Annotation *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint64 uVar2;
  string *s;
  char cVar3;
  uint uVar4;
  uint32 tag;
  char *local_50;
  uint local_44;
  InternalMetadataWithArena *local_40;
  RepeatedField<int> *local_38;
  
  local_40 = &this->_internal_metadata_;
  local_38 = &this->path_;
  uVar4 = 0;
  local_50 = ptr;
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) goto LAB_002b67ae;
    local_50 = internal::ReadTag(local_50,&local_44,0);
    if (local_50 == (char *)0x0) break;
    cVar3 = (char)local_44;
    switch(local_44 >> 3) {
    case 1:
      if (cVar3 == '\n') {
        local_50 = internal::PackedInt32Parser(local_38,local_50,ctx);
      }
      else {
        if ((local_44 & 0xff) != 8) goto switchD_002b66e5_default;
        uVar2 = internal::ReadVarint(&local_50);
        _internal_add_path(this,(int32)uVar2);
      }
      break;
    case 2:
      if (cVar3 != '\x12') goto switchD_002b66e5_default;
      s = _internal_mutable_source_file_abi_cxx11_(this);
      local_50 = internal::InlineGreedyStringParser(s,local_50,ctx);
      break;
    case 3:
      if (cVar3 != '\x18') goto switchD_002b66e5_default;
      uVar4 = uVar4 | 2;
      uVar2 = internal::ReadVarint(&local_50);
      this->begin_ = (int32)uVar2;
      break;
    case 4:
      if (cVar3 != ' ') goto switchD_002b66e5_default;
      uVar4 = uVar4 | 4;
      uVar2 = internal::ReadVarint(&local_50);
      this->end_ = (int32)uVar2;
      break;
    default:
switchD_002b66e5_default:
      if ((local_44 == 0) || ((local_44 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
        goto LAB_002b67ae;
      }
      local_50 = internal::UnknownFieldParse(local_44,local_40,local_50,ctx);
    }
  } while (local_50 != (char *)0x0);
  local_50 = (char *)0x0;
LAB_002b67ae:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  return local_50;
}

Assistant:

const char* GeneratedCodeInfo_Annotation::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_file = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_file(), ptr, ctx, "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 begin = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}